

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeLinear>::SideShapeFunction
          (TPZCompElHDiv<pzshape::TPZShapeLinear> *this,int side,TPZVec<double> *point,
          TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  MElementType MVar4;
  int iVar5;
  int iVar6;
  int64_t iVar7;
  TPZConnect *this_00;
  TPZGeoNode *this_01;
  long *plVar8;
  int *piVar9;
  double *pdVar10;
  TPZVec<double> *in_RDX;
  int in_ESI;
  long *in_RDI;
  int d;
  int i;
  int nshape;
  int kfirst;
  int ifirst;
  int side_1;
  TPZFNMatrix<9,_double> axes;
  TPZFNMatrix<9,_double> jacinv;
  TPZFNMatrix<9,_double> jac;
  int dim;
  TPZGeoElSide gelside;
  REAL detjac;
  int localside;
  int ls;
  TPZManVector<long,_28> FirstIndex;
  int ncs;
  TPZFNMatrix<50,_double> dphiloc;
  TPZFNMatrix<50,_double> philoc;
  int sidedimension;
  TPZManVector<int,_3> ord;
  MElementType sidetype;
  int transformid;
  TPZManVector<int,_9> permutegather;
  int locid;
  int ic_1;
  TPZManVector<long,_8> id;
  int nsn;
  TPZGeoEl *gel;
  int ic;
  int is;
  int order;
  int connectlocid;
  int nsideshape;
  int ncontained;
  undefined4 in_stack_fffffffffffff578;
  int in_stack_fffffffffffff57c;
  TPZManVector<long,_28> *in_stack_fffffffffffff580;
  TPZGeoEl *in_stack_fffffffffffff588;
  TPZGeoEl *in_stack_fffffffffffff590;
  TPZVec<double> *in_stack_fffffffffffff598;
  TPZFNMatrix<50,_double> *in_stack_fffffffffffff5a0;
  TPZVec<long> *in_stack_fffffffffffff5a8;
  TPZManVector<long,_28> *in_stack_fffffffffffff5b0;
  TPZVec<long> *in_stack_fffffffffffff5e8;
  int local_998;
  int local_994;
  int local_984;
  double local_6c0;
  int local_6b4;
  TPZVec<long> local_6a8 [2];
  size_t in_stack_fffffffffffff998;
  char *in_stack_fffffffffffff9a0;
  TPZVec<int> local_110 [2];
  int local_b8;
  int local_b4;
  TPZVec<long> local_b0 [3];
  int local_4c;
  TPZGeoEl *local_48;
  int local_40;
  int local_3c;
  uint local_38;
  undefined4 local_34;
  int local_30;
  int local_2c;
  int local_c;
  
  local_c = in_ESI;
  if ((in_ESI == 3) || (iVar7 = TPZVec<double>::size(in_RDX), iVar7 != 0)) {
    std::operator<<((ostream *)&std::cout,"Don\'t have side shape associated to this side");
    pzinternal::DebugStopImpl(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
  }
  iVar3 = pztopology::TPZLine::SideDimension(0x19f7bef);
  if (iVar3 == 0) {
    local_2c = pztopology::TPZLine::NContainedSides(0x19f7c08);
    local_30 = 0;
    local_34 = (**(code **)(*in_RDI + 0x250))(in_RDI,0,local_c);
    this_00 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_34);
    bVar2 = TPZConnect::Order(this_00);
    local_38 = (uint)bVar2;
    for (local_3c = 0; local_3c < local_2c; local_3c = local_3c + 1) {
      local_40 = pztopology::TPZLine::ContainedSideLocId
                           ((int)in_stack_fffffffffffff580,in_stack_fffffffffffff57c);
      iVar3 = pzshape::TPZShapeLinear::NConnectShapeF
                        ((int)in_stack_fffffffffffff580,in_stack_fffffffffffff57c);
      local_30 = iVar3 + local_30;
    }
    local_48 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffff588);
    local_4c = pztopology::TPZLine::NSideNodes(local_c);
    TPZManVector<long,_8>::TPZManVector
              ((TPZManVector<long,_8> *)in_stack_fffffffffffff5a0,(int64_t)in_stack_fffffffffffff598
              );
    for (local_b4 = 0; local_b4 < local_4c; local_b4 = local_b4 + 1) {
      local_b8 = pztopology::TPZLine::SideNodeLocId
                           ((int)in_stack_fffffffffffff580,in_stack_fffffffffffff57c);
      this_01 = TPZGeoEl::Node(in_stack_fffffffffffff590,
                               (int)((ulong)in_stack_fffffffffffff588 >> 0x20));
      iVar3 = TPZGeoNode::Id(this_01);
      plVar8 = TPZVec<long>::operator[](local_b0,(long)local_b4);
      *plVar8 = (long)iVar3;
    }
    TPZManVector<int,_9>::TPZManVector
              ((TPZManVector<int,_9> *)in_stack_fffffffffffff5a0,(int64_t)in_stack_fffffffffffff598)
    ;
    MVar4 = pztopology::TPZLine::Type(local_c);
    if (MVar4 == EOned) {
      pztopology::TPZLine::GetTransformId(&in_stack_fffffffffffff580->super_TPZVec<long>);
      pztopology::TPZLine::GetSideHDivPermutation
                ((int)((ulong)in_stack_fffffffffffff580 >> 0x20),
                 (TPZVec<int> *)CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578));
    }
    else if (MVar4 == ETriangle) {
      pztopology::TPZTriangle::GetTransformId(in_stack_fffffffffffff5a8);
      pztopology::TPZTriangle::GetSideHDivPermutation
                ((int)((ulong)in_stack_fffffffffffff580 >> 0x20),
                 (TPZVec<int> *)CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578));
    }
    else if (MVar4 == EQuadrilateral) {
      pztopology::TPZQuadrilateral::GetTransformId(in_stack_fffffffffffff5e8);
      pztopology::TPZQuadrilateral::GetSideHDivPermutation
                ((int)((ulong)in_stack_fffffffffffff590 >> 0x20),
                 (TPZVec<int> *)in_stack_fffffffffffff588);
    }
    else {
      pzinternal::DebugStopImpl(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    }
    TPZManVector<int,_3>::TPZManVector
              ((TPZManVector<int,_3> *)in_stack_fffffffffffff5b0,(int64_t)in_stack_fffffffffffff5a8,
               (int *)in_stack_fffffffffffff5a0);
    iVar3 = pztopology::TPZLine::SideDimension(0x19f7f79);
    TPZFNMatrix<50,_double>::TPZFNMatrix
              (in_stack_fffffffffffff5a0,(int64_t)in_stack_fffffffffffff598,
               (int64_t)in_stack_fffffffffffff590);
    TPZFNMatrix<50,_double>::TPZFNMatrix
              (in_stack_fffffffffffff5a0,(int64_t)in_stack_fffffffffffff598,
               (int64_t)in_stack_fffffffffffff590);
    pzshape::TPZShapeLinear::SideShape
              ((int)((ulong)in_stack_fffffffffffff5a0 >> 0x20),in_stack_fffffffffffff598,
               (TPZVec<long> *)in_stack_fffffffffffff590,(TPZVec<int> *)in_stack_fffffffffffff588,
               (TPZFMatrix<double> *)in_stack_fffffffffffff580,
               (TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578));
    iVar5 = pztopology::TPZLine::NContainedSides(0x19f800d);
    TPZManVector<long,_28>::TPZManVector
              (in_stack_fffffffffffff5b0,(int64_t)in_stack_fffffffffffff5a8,
               (long *)in_stack_fffffffffffff5a0);
    for (local_6b4 = 0; local_6b4 < iVar5; local_6b4 = local_6b4 + 1) {
      pztopology::TPZLine::ContainedSideLocId
                ((int)in_stack_fffffffffffff580,in_stack_fffffffffffff57c);
      plVar8 = TPZVec<long>::operator[](local_6a8,(long)local_6b4);
      lVar1 = *plVar8;
      iVar6 = pzshape::TPZShapeLinear::NConnectShapeF
                        ((int)in_stack_fffffffffffff580,in_stack_fffffffffffff57c);
      plVar8 = TPZVec<long>::operator[](local_6a8,(long)(local_6b4 + 1));
      *plVar8 = lVar1 + iVar6;
    }
    local_6c0 = 1.0;
    TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffff588);
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)in_stack_fffffffffffff590,in_stack_fffffffffffff588,
               (int)((ulong)in_stack_fffffffffffff580 >> 0x20));
    (**(code **)(*(long *)local_48 + 0x208))(local_48,local_c);
    TPZFNMatrix<9,_double>::TPZFNMatrix
              ((TPZFNMatrix<9,_double> *)in_stack_fffffffffffff5a0,
               (int64_t)in_stack_fffffffffffff598,(int64_t)in_stack_fffffffffffff590);
    TPZFNMatrix<9,_double>::TPZFNMatrix
              ((TPZFNMatrix<9,_double> *)in_stack_fffffffffffff5a0,
               (int64_t)in_stack_fffffffffffff598,(int64_t)in_stack_fffffffffffff590);
    TPZFNMatrix<9,_double>::TPZFNMatrix
              ((TPZFNMatrix<9,_double> *)in_stack_fffffffffffff5a0,
               (int64_t)in_stack_fffffffffffff598,(int64_t)in_stack_fffffffffffff590);
    TPZGeoElSide::Jacobian
              ((TPZGeoElSide *)axes.fBuf[3],(TPZVec<double> *)axes.fBuf[2],
               (TPZFMatrix<double> *)axes.fBuf[1],(TPZFMatrix<double> *)axes.fBuf[0],
               (REAL *)axes.super_TPZFMatrix<double>.fWork.fNAlloc,
               (TPZFMatrix<double> *)axes.super_TPZFMatrix<double>.fWork.fNElements);
    TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x19f82b2);
    TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x19f82bf);
    TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x19f82cc);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x19f82d9);
    if (MVar4 == ETriangle) {
      local_6c0 = 0.16666666666666666;
    }
    for (local_984 = 0; local_984 < iVar5; local_984 = local_984 + 1) {
      TPZVec<long>::operator[](local_6a8,(long)local_984);
      piVar9 = TPZVec<int>::operator[](local_110,(long)local_984);
      TPZVec<long>::operator[](local_6a8,(long)*piVar9);
      plVar8 = TPZVec<long>::operator[](local_6a8,(long)(local_984 + 1));
      iVar6 = (int)*plVar8;
      plVar8 = TPZVec<long>::operator[](local_6a8,(long)local_984);
      lVar1 = *plVar8;
      for (local_994 = 0; local_994 < iVar6 - (int)lVar1; local_994 = local_994 + 1) {
        pdVar10 = TPZFMatrix<double>::operator()
                            (&in_stack_fffffffffffff5a0->super_TPZFMatrix<double>,
                             (int64_t)in_stack_fffffffffffff598,(int64_t)in_stack_fffffffffffff590);
        in_stack_fffffffffffff598 = (TPZVec<double> *)(*pdVar10 / local_6c0);
        in_stack_fffffffffffff5a0 =
             (TPZFNMatrix<50,_double> *)
             TPZFMatrix<double>::operator()
                       (&in_stack_fffffffffffff5a0->super_TPZFMatrix<double>,
                        (int64_t)in_stack_fffffffffffff598,(int64_t)in_stack_fffffffffffff590);
        (in_stack_fffffffffffff5a0->super_TPZFMatrix<double>).super_TPZMatrix<double>.
        super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)in_stack_fffffffffffff598;
        for (local_998 = 0; local_998 < iVar3; local_998 = local_998 + 1) {
          in_stack_fffffffffffff590 =
               (TPZGeoEl *)
               TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffff5a0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffff598,(int64_t)in_stack_fffffffffffff590);
          in_stack_fffffffffffff580 =
               (TPZManVector<long,_28> *)(*(double *)in_stack_fffffffffffff590 / local_6c0);
          pdVar10 = TPZFMatrix<double>::operator()
                              (&in_stack_fffffffffffff5a0->super_TPZFMatrix<double>,
                               (int64_t)in_stack_fffffffffffff598,(int64_t)in_stack_fffffffffffff590
                              );
          *pdVar10 = (double)in_stack_fffffffffffff580;
        }
      }
    }
    TPZManVector<long,_28>::~TPZManVector(in_stack_fffffffffffff580);
    TPZFNMatrix<50,_double>::~TPZFNMatrix((TPZFNMatrix<50,_double> *)0x19f862d);
    TPZFNMatrix<50,_double>::~TPZFNMatrix((TPZFNMatrix<50,_double> *)0x19f863a);
    TPZManVector<int,_3>::~TPZManVector((TPZManVector<int,_3> *)in_stack_fffffffffffff580);
    TPZManVector<int,_9>::~TPZManVector((TPZManVector<int,_9> *)in_stack_fffffffffffff580);
    TPZManVector<long,_8>::~TPZManVector((TPZManVector<long,_8> *)in_stack_fffffffffffff580);
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SideShapeFunction(int side,TPZVec<REAL> &point,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {

    if(side==TSHAPE::NSides || point.size() != TSHAPE::Dimension-1){
        std::cout<<"Don't have side shape associated to this side";
        DebugStop();
    }
	if(TSHAPE::SideDimension(side)!= TSHAPE::Dimension -1 ){
		return ;
	}
    int ncontained = TSHAPE::NContainedSides(side);
    int nsideshape = 0;
    int connectlocid = SideConnectLocId(0, side);
    int order = this->Connect(connectlocid).Order();
    int is;
    for (is=0; is<ncontained; is++) {
        int ic = TSHAPE::ContainedSideLocId(side,is);
        nsideshape += TSHAPE::NConnectShapeF(ic,order);
    }
#ifdef PZDEBUG
    if (nsideshape != this->NSideShapeF(side)) {
        DebugStop();
    }
#endif

    TPZGeoEl *gel = this->Reference();
    //int nc = gel->NCornerNodes();
    int nsn = TSHAPE::NSideNodes(side);
    TPZManVector<int64_t,8> id(nsn);
    for (int ic=0; ic<nsn; ic++) {
        int locid = TSHAPE::SideNodeLocId(side,ic);
        id[ic] = gel->Node(locid).Id();
    }

    //int idsize = id.size();
    TPZManVector<int,9> permutegather(ncontained);
    int transformid;


    MElementType sidetype = TSHAPE::Type(side);
    switch (sidetype) {
        case EOned:
            transformid = pztopology::TPZLine::GetTransformId(id);
            pztopology::TPZLine::GetSideHDivPermutation(transformid, permutegather);
            break;
        case EQuadrilateral:
            transformid = pztopology::TPZQuadrilateral::GetTransformId(id);
            pztopology::TPZQuadrilateral::GetSideHDivPermutation(transformid, permutegather);
            break;
        case ETriangle:
            transformid = pztopology::TPZTriangle::GetTransformId(id);
            pztopology::TPZTriangle::GetSideHDivPermutation(transformid, permutegather);
            break;
        default:
            DebugStop();
            break;
    }

    TPZManVector<int,TSHAPE::NSides> ord(TSHAPE::NSides,order);

    int sidedimension = TSHAPE::SideDimension(side);
    TPZFNMatrix<50,REAL> philoc(nsideshape,1),dphiloc(sidedimension,nsideshape);

    TSHAPE::SideShape(side,point,id,ord,philoc,dphiloc);

    int ncs = TSHAPE::NContainedSides(side);
    TPZManVector<int64_t,28> FirstIndex(ncs+1,0);
    for (int ls=0; ls<ncs; ls++) {
        int localside = TSHAPE::ContainedSideLocId(side,ls);
        FirstIndex[ls+1] = FirstIndex[ls]+TSHAPE::NConnectShapeF(localside,order);
    }

    REAL detjac = 1.;
    {
        TPZGeoElSide gelside = TPZGeoElSide(this->Reference(),side);
        int dim = gel->SideDimension(side);
        TPZFNMatrix<9,REAL> jac(dim,dim),jacinv(dim,dim),axes(dim,3);
        gelside.Jacobian(point, jac, axes, detjac, jacinv);
    }
    if(sidetype == ETriangle) detjac /= 6.;
    for (int side=0; side < ncs; side++) {
        int ifirst = FirstIndex[side];
        int kfirst = FirstIndex[permutegather[side]];
        int nshape = FirstIndex[side+1]-FirstIndex[side];
        for (int i=0; i<nshape; i++) {
            phi(ifirst+i,0) = philoc(kfirst+i,0)/detjac;
            for (int d=0; d< sidedimension; d++) {
                dphi(d,ifirst+i) = dphiloc(d,kfirst+i)/detjac;
            }
        }
    }

}